

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

bool __thiscall
draco::CornerTable::Init
          (CornerTable *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
          *faces)

{
  pointer piVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pIVar5;
  bool bVar6;
  pointer paVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int i;
  long lVar11;
  int num_vertices;
  int local_1c;
  
  piVar1 = (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
  }
  pcVar3 = (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
  }
  std::
  vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ::resize((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            *)this,(long)(faces->vector_).
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(faces->vector_).
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2);
  paVar7 = (faces->vector_).
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(faces->vector_).
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar7 >> 2) *
          -0x5555555555555555;
  if ((int)uVar8 != 0) {
    pIVar5 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = 0;
    uVar10 = 0;
    do {
      lVar11 = 0;
      do {
        pIVar5[(uint)(iVar9 + (int)lVar11)].value_ = paVar7->_M_elems[lVar11].value_;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      uVar10 = uVar10 + 1;
      iVar9 = iVar9 + 3;
      paVar7 = paVar7 + 1;
    } while (uVar10 != (uVar8 & 0xffffffff));
  }
  local_1c = -1;
  bVar6 = ComputeOppositeCorners(this,&local_1c);
  if (bVar6) {
    BreakNonManifoldEdges(this);
    ComputeVertexCorners(this,local_1c);
  }
  return bVar6;
}

Assistant:

bool CornerTable::Init(const IndexTypeVector<FaceIndex, FaceType> &faces) {
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  corner_to_vertex_map_.resize(faces.size() * 3);
  for (FaceIndex fi(0); fi < static_cast<uint32_t>(faces.size()); ++fi) {
    for (int i = 0; i < 3; ++i) {
      corner_to_vertex_map_[FirstCorner(fi) + i] = faces[fi][i];
    }
  }
  int num_vertices = -1;
  if (!ComputeOppositeCorners(&num_vertices)) {
    return false;
  }
  if (!BreakNonManifoldEdges()) {
    return false;
  }
  if (!ComputeVertexCorners(num_vertices)) {
    return false;
  }
  return true;
}